

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::dart_library
          (string *__return_storage_ptr__,t_dart_generator *this,string *file_name)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string out;
  string *file_name_local;
  t_dart_generator *this_local;
  
  out.field_2._8_8_ = file_name;
  std::operator+(&local_60,"library ",&this->library_prefix_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,&this->library_name_);
  std::__cxx11::string::~string((string *)&local_60);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+(&local_b0,".",file_name);
      std::__cxx11::string::operator+=((string *)local_40,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      std::operator+(&local_90,".src.",file_name);
      std::__cxx11::string::operator+=((string *)local_40,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,";\n"
                );
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::dart_library(string file_name) {
  string out = "library " + library_prefix_ + library_name_;
  if (!file_name.empty()) {
    if (library_prefix_.empty()) {
      out += ".src." + file_name;
    } else {
      out += "." + file_name;
    }
  }
  return out + ";\n";
}